

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char c;
  int p;
  queue<int> q;
  byte local_55;
  int local_54;
  queue<int> local_50;
  
  local_50.mData = (int *)operator_new__(4);
  *local_50.mData = 0;
  local_50.mCap = 1;
  local_50.mSize = 0;
  local_50.mFront = 0;
  __isoc99_scanf("%c",&local_55);
  do {
    switch(local_55) {
    case 0x6d:
      __isoc99_scanf("%d",&local_54);
      lVar2 = (long)local_54;
      if (lVar2 != 0) {
        lVar5 = -lVar2;
        uVar3 = lVar2 + local_50.mFront;
        do {
          uVar4 = uVar3 % local_50.mCap;
          uVar3 = uVar3 - 1;
          iVar1 = local_50.mData[uVar4];
          local_50.mData[uVar4] = local_50.mData[uVar3 % local_50.mCap];
          local_50.mData[uVar3 % local_50.mCap] = iVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
      break;
    case 0x6f:
      CP::queue<int>::pop(&local_50);
      break;
    case 0x70:
      CP::queue<int>::print(&local_50);
      break;
    case 0x71:
      if (local_50.mData != (int *)0x0) {
        operator_delete__(local_50.mData);
      }
      return 0;
    case 0x75:
      __isoc99_scanf("%d",&local_54);
      CP::queue<int>::push(&local_50,&local_54);
    }
    __isoc99_scanf("%c",&local_55);
  } while( true );
}

Assistant:

int main() {
  CP::queue<int> q;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'u') {
      // add data
      int v;
      scanf("%d", &v);
      q.push(v);
    } else if (c == 'o') {
      q.pop();
    } else if (c == 'p') {
      q.print();
    } else if (c == 'm') {
      int p;
      scanf("%d", &p);
      q.move_to_front(p);
    }
    scanf("%c", &c);
  }
  return 0;
}